

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall QMessageBoxPrivate::initHelper(QMessageBoxPrivate *this,QPlatformDialogHelper *h)

{
  void **ppvVar1;
  undefined4 *puVar2;
  long in_FS_OFFSET;
  ulong uVar3;
  QObject local_50 [8];
  Object local_48 [8];
  code *local_40;
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = helperClicked;
  uStack_38 = 0;
  uVar3 = 0;
  QObjectPrivate::
  connect<void(QPlatformMessageDialogHelper::*)(QPlatformDialogHelper::StandardButton,QPlatformDialogHelper::ButtonRole),void(QMessageBoxPrivate::*)(QPlatformDialogHelper::StandardButton,QPlatformDialogHelper::ButtonRole)>
            (local_48,(offset_in_QPlatformMessageDialogHelper_to_subr)h,
             (Object *)QPlatformMessageDialogHelper::clicked,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  ppvVar1 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_40 = QPlatformMessageDialogHelper::checkBoxStateChanged;
  uStack_38 = 0;
  puVar2 = (undefined4 *)operator_new(0x18);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/dialogs/qmessagebox.cpp:2771:16),_QtPrivate::List<Qt::CheckState>,_void>
       ::impl;
  *(QMessageBoxPrivate **)(puVar2 + 4) = this;
  QObject::connectImpl
            (local_50,(void **)h,(QObject *)&local_40,ppvVar1,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar2,(int *)(uVar3 & 0xffffffff00000000),(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QPlatformMessageDialogHelper::setOptions((QSharedPointer *)h);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBoxPrivate::initHelper(QPlatformDialogHelper *h)
{
    auto *messageDialogHelper = static_cast<QPlatformMessageDialogHelper *>(h);
    QObjectPrivate::connect(messageDialogHelper, &QPlatformMessageDialogHelper::clicked,
                            this, &QMessageBoxPrivate::helperClicked);
    // Forward state via lambda, so that we can handle addition and removal
    // of checkbox via setCheckBox() after initializing helper.
    QObject::connect(messageDialogHelper, &QPlatformMessageDialogHelper::checkBoxStateChanged,
        q_ptr, [this](Qt::CheckState state) {
            if (checkbox)
                checkbox->setCheckState(state);
        }
    );
    messageDialogHelper->setOptions(options);
}